

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall ghc::filesystem::directory_iterator::impl::increment(impl *this,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  EnableBitmask<ghc::filesystem::directory_options> EVar3;
  int iVar4;
  int *piVar5;
  dirent *pdVar6;
  error_code eVar7;
  undefined4 uStack_2c;
  bool skip;
  error_code *ec_local;
  impl *this_local;
  
  if (this->_dir != (DIR *)0x0) {
    do {
      bVar1 = false;
      piVar5 = __errno_location();
      *piVar5 = 0;
      pdVar6 = readdir((DIR *)this->_dir);
      this->_entry = (dirent *)pdVar6;
      if (this->_entry == (dirent *)0x0) {
        closedir((DIR *)this->_dir);
        this->_dir = (DIR *)0x0;
        path::clear(&(this->_dir_entry)._path);
        piVar5 = __errno_location();
        if (*piVar5 == 0) {
          return;
        }
        eVar7 = detail::make_system_error(0);
        *(ulong *)ec = CONCAT44(uStack_2c,eVar7._M_value);
        ec->_M_cat = eVar7._M_cat;
        return;
      }
      path::operator=(&(this->_dir_entry)._path,&this->_base);
      path::append_name(&(this->_dir_entry)._path,this->_entry->d_name);
      copyToDirEntry(this);
      bVar2 = std::error_code::operator_cast_to_bool(ec);
      if ((bVar2) &&
         (((iVar4 = std::error_code::value(ec), iVar4 == 0xd ||
           (iVar4 = std::error_code::value(ec), iVar4 == 1)) &&
          (EVar3 = operator&(this->_options,skip_permission_denied), EVar3 == skip_permission_denied
          )))) {
        std::error_code::clear(ec);
        bVar1 = true;
      }
      bVar2 = true;
      if (!bVar1) {
        iVar4 = strcmp(this->_entry->d_name,".");
        bVar2 = true;
        if (iVar4 != 0) {
          iVar4 = strcmp(this->_entry->d_name,"..");
          bVar2 = iVar4 == 0;
        }
      }
    } while (bVar2);
  }
  return;
}

Assistant:

void increment(std::error_code& ec)
    {
        if (_dir) {
            bool skip;
            do {
                skip = false;
                errno = 0;
                _entry = ::readdir(_dir);
                if (_entry) {
                    _dir_entry._path = _base;
                    _dir_entry._path.append_name(_entry->d_name);
                    copyToDirEntry();
                    if (ec && (ec.value() == EACCES || ec.value() == EPERM) && (_options & directory_options::skip_permission_denied) == directory_options::skip_permission_denied) {
                        ec.clear();
                        skip = true;
                    }
                }
                else {
                    ::closedir(_dir);
                    _dir = nullptr;
                    _dir_entry._path.clear();
                    if (errno) {
                        ec = detail::make_system_error();
                    }
                    break;
                }
            } while (skip || std::strcmp(_entry->d_name, ".") == 0 || std::strcmp(_entry->d_name, "..") == 0);
        }
    }